

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall
Player::Player(Player *this,vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries,
              Hand *cards,DiceRoller *diceRoller,int playerId)

{
  int *piVar1;
  PlayerStrategy *this_00;
  PlayerState *pPVar2;
  list<Observer_*,_std::allocator<Observer_*>_> *this_01;
  int playerId_local;
  DiceRoller *diceRoller_local;
  Hand *cards_local;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries_local;
  Player *this_local;
  
  this->pOwnedCountries = ownedCountries;
  this->pCards = cards;
  this->pDiceRoller = diceRoller;
  piVar1 = (int *)operator_new(4);
  *piVar1 = playerId;
  this->pPlayerId = piVar1;
  this_00 = (PlayerStrategy *)operator_new(0x40);
  HumanPlayerStrategy::HumanPlayerStrategy((HumanPlayerStrategy *)this_00);
  this->strategy = this_00;
  pPVar2 = (PlayerState *)operator_new(4);
  *pPVar2 = IDLE;
  this->currentState = pPVar2;
  this_01 = (list<Observer_*,_std::allocator<Observer_*>_> *)operator_new(0x18);
  memset(this_01,0,0x18);
  std::__cxx11::list<Observer_*,_std::allocator<Observer_*>_>::list(this_01);
  this->pObservers = this_01;
  return;
}

Assistant:

Player::Player(std::vector<Map::Country*>* ownedCountries, Hand* cards, DiceRoller* diceRoller, const int playerId) {
    pOwnedCountries = ownedCountries;
    pCards = cards;
    pDiceRoller = diceRoller;
    pPlayerId = new int(playerId);
    strategy = new HumanPlayerStrategy();
    currentState = new PlayerState(IDLE);
    pObservers = new std::list<Observer*>();
}